

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_parser.c
# Opt level: O2

char * flatcc_json_parser_char_array(flatcc_json_parser_t *ctx,char *buf,char *end,char *s,size_t n)

{
  char *pcVar1;
  char *buf_00;
  ulong uVar2;
  flatcc_json_parser_escape_buffer_t code;
  char local_35;
  undefined1 local_34 [4];
  
  pcVar1 = flatcc_json_parser_string_start(ctx,buf,end);
  if (pcVar1 != end) {
    while (*pcVar1 != '\"') {
      buf_00 = flatcc_json_parser_string_part(ctx,pcVar1,end);
      if (buf_00 == end) {
        return end;
      }
      uVar2 = (long)buf_00 - (long)pcVar1;
      if ((n < (ulong)((long)buf_00 - (long)pcVar1)) && (uVar2 = n, (ctx->flags & 8) == 0)) {
        if (ctx->error != 0) {
          return end;
        }
        ctx->error = 0x22;
        ctx->pos = ((int)buf_00 - *(int *)&ctx->line_start) + 1;
        ctx->error_loc = buf_00;
        return end;
      }
      memcpy(s,pcVar1,uVar2);
      s = s + uVar2;
      n = n - uVar2;
      pcVar1 = buf_00;
      if (*buf_00 == '\"') break;
      pcVar1 = flatcc_json_parser_string_escape(ctx,buf_00,end,&local_35);
      if (pcVar1 == end) {
        return end;
      }
      uVar2 = (long)local_35;
      if ((n < (ulong)(long)local_35) && (uVar2 = n, (ctx->flags & 8) == 0)) {
        if (ctx->error != 0) {
          return end;
        }
        ctx->error = 0x22;
        goto LAB_00117f32;
      }
      memcpy(s,local_34,uVar2);
      s = s + uVar2;
      n = n - uVar2;
    }
  }
  if (n != 0) {
    if ((ctx->flags & 0x10) != 0) {
      if (ctx->error == 0) {
        ctx->error = 0x21;
LAB_00117f32:
        ctx->pos = ((int)pcVar1 - *(int *)&ctx->line_start) + 1;
        ctx->error_loc = pcVar1;
      }
      return end;
    }
    memset(s,0,n);
  }
  pcVar1 = flatcc_json_parser_string_end(ctx,pcVar1,end);
  return pcVar1;
}

Assistant:

const char *flatcc_json_parser_char_array(flatcc_json_parser_t *ctx,
        const char *buf, const char *end, char *s, size_t n)
{
    flatcc_json_parser_escape_buffer_t code;
    const char *mark;
    size_t k = 0;

    buf = flatcc_json_parser_string_start(ctx, buf, end);
    if (buf != end)
    while (*buf != '\"') {
        buf = flatcc_json_parser_string_part(ctx, (mark = buf), end);
        if (buf == end) return end;
        k = (size_t)(buf - mark);
        if (k > n) {
            if (!(ctx->flags & flatcc_json_parser_f_skip_array_overflow)) {
                return flatcc_json_parser_set_error(ctx, buf, end, flatcc_json_parser_error_array_overflow);
            }
            k = n; /* Might truncate UTF-8. */
        }
        memcpy(s, mark, k);
        s += k;
        n -= k;
        if (*buf == '\"') break;
        buf = flatcc_json_parser_string_escape(ctx, buf, end, code);
        if (buf == end) return end;
        k = (size_t)code[0];
        mark = code + 1;
        if (k > n) {
            if (!(ctx->flags & flatcc_json_parser_f_skip_array_overflow)) {
                return flatcc_json_parser_set_error(ctx, buf, end, flatcc_json_parser_error_array_overflow);
            }
            k = n; /* Might truncate UTF-8. */
        }
        memcpy(s, mark, k);
        s += k;
        n -= k;
    }
    if (n != 0) {
        if (ctx->flags & flatcc_json_parser_f_reject_array_underflow) {
            return flatcc_json_parser_set_error(ctx, buf, end, flatcc_json_parser_error_array_underflow);
        }
        memset(s, 0, n);
    }
    return flatcc_json_parser_string_end(ctx, buf, end);
}